

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O2

void __thiscall
duckdb::MetaPipeline::AddRecursiveDependencies
          (MetaPipeline *this,
          vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *new_dependencies,
          MetaPipeline *last_child)

{
  element_type *peVar1;
  shared_ptr<duckdb::Pipeline,_true> *psVar2;
  bool bVar3;
  type pMVar4;
  TaskScheduler *pTVar5;
  unsigned_long thread_count;
  type pPVar6;
  vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
  *this_00;
  shared_ptr<duckdb::Pipeline,_true> *pipeline;
  shared_ptr<duckdb::Pipeline,_true> *this_01;
  shared_ptr<duckdb::Pipeline,_true> *new_dependency;
  shared_ptr<duckdb::Pipeline,_true> *this_02;
  shared_ptr<duckdb::MetaPipeline,_true> *local_70;
  key_type local_68;
  _Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_60;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *__range3;
  shared_ptr<duckdb::Pipeline,_true> *local_50;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> child_meta_pipelines;
  
  if (this->recursive_cte == false) {
    child_meta_pipelines.
    super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    .
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    child_meta_pipelines.
    super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    .
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    child_meta_pipelines.
    super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    .
    super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __range3 = new_dependencies;
    GetMetaPipelines(this,&child_meta_pipelines,true,false);
    local_70 = child_meta_pipelines.
               super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               .
               super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      pMVar4 = shared_ptr<duckdb::MetaPipeline,_true>::operator*(local_70);
      if (pMVar4 == last_child) break;
      local_70 = local_70 + 1;
    }
    pTVar5 = TaskScheduler::GetScheduler(this->executor->context);
    thread_count = NumericCastImpl<unsigned_long,_int,_false>::Convert
                             ((pTVar5->current_thread_count).super___atomic_base<int>._M_i);
    local_60 = (_Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->pipeline_dependencies;
    while (local_70 = local_70 + 1,
          local_70 !=
          child_meta_pipelines.
          super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      peVar1 = (local_70->internal).
               super___shared_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50 = *(pointer *)
                  ((long)&(peVar1->pipelines).
                          super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                          .
                          super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                          ._M_impl + 8);
      for (this_01 = (peVar1->pipelines).
                     super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                     .
                     super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_01 != local_50;
          this_01 = this_01 + 1) {
        pPVar6 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_01);
        bVar3 = PipelineExceedsThreadCount(pPVar6,thread_count);
        if (bVar3) {
          local_68._M_data = shared_ptr<duckdb::Pipeline,_true>::operator*(this_01);
          this_00 = (vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
                     *)::std::__detail::
                       _Map_base<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](local_60,&local_68);
          psVar2 = (__range3->
                   super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                   ).
                   super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (this_02 = (__range3->
                         super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                         ).
                         super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_02 != psVar2;
              this_02 = this_02 + 1) {
            pPVar6 = shared_ptr<duckdb::Pipeline,_true>::operator*(this_02);
            bVar3 = PipelineExceedsThreadCount(pPVar6,thread_count);
            if (bVar3) {
              local_68._M_data = shared_ptr<duckdb::Pipeline,_true>::operator*(this_02);
              ::std::
              vector<std::reference_wrapper<duckdb::Pipeline>,std::allocator<std::reference_wrapper<duckdb::Pipeline>>>
              ::emplace_back<std::reference_wrapper<duckdb::Pipeline>>(this_00,&local_68);
            }
          }
        }
      }
    }
    ::std::
    vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
    ::~vector(&child_meta_pipelines.
               super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             );
  }
  return;
}

Assistant:

void MetaPipeline::AddRecursiveDependencies(const vector<shared_ptr<Pipeline>> &new_dependencies,
                                            const MetaPipeline &last_child) {
	if (recursive_cte) {
		return; // let's not burn our fingers on this for now
	}

	vector<shared_ptr<MetaPipeline>> child_meta_pipelines;
	this->GetMetaPipelines(child_meta_pipelines, true, false);

	// find the meta pipeline that has the same sink as 'pipeline'
	auto it = child_meta_pipelines.begin();
	for (; !RefersToSameObject(last_child, **it); it++) {
	}
	D_ASSERT(it != child_meta_pipelines.end());

	// skip over it
	it++;

	// we try to limit the performance impact of these dependencies on smaller workloads,
	// by only adding the dependencies if the source operator can likely keep all threads busy
	const auto thread_count = NumericCast<idx_t>(TaskScheduler::GetScheduler(executor.context).NumberOfThreads());
	for (; it != child_meta_pipelines.end(); it++) {
		for (auto &pipeline : it->get()->pipelines) {
			if (!PipelineExceedsThreadCount(*pipeline, thread_count)) {
				continue;
			}
			auto &pipeline_deps = pipeline_dependencies[*pipeline];
			for (auto &new_dependency : new_dependencies) {
				if (!PipelineExceedsThreadCount(*new_dependency, thread_count)) {
					continue;
				}
				pipeline_deps.push_back(*new_dependency);
			}
		}
	}
}